

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coptccal.cpp
# Opt level: O2

void __thiscall
icu_63::CopticCalendar::handleComputeFields
          (CopticCalendar *this,int32_t julianDay,UErrorCode *param_2)

{
  int iVar1;
  int32_t day;
  int32_t month;
  int32_t eyear;
  
  iVar1 = (*(this->super_CECalendar).super_Calendar.super_UObject._vptr_UObject[0x32])();
  CECalendar::jdToCE(julianDay,iVar1,&eyear,&month,&day);
  iVar1 = 1 - eyear;
  if (0 < eyear) {
    iVar1 = eyear;
  }
  (this->super_CECalendar).super_Calendar.fFields[0x13] = eyear;
  (this->super_CECalendar).super_Calendar.fStamp[0x13] = 1;
  (this->super_CECalendar).super_Calendar.fIsSet[0x13] = '\x01';
  (this->super_CECalendar).super_Calendar.fFields[0] = (uint)(0 < eyear);
  (this->super_CECalendar).super_Calendar.fStamp[0] = 1;
  (this->super_CECalendar).super_Calendar.fStamp[1] = 1;
  (this->super_CECalendar).super_Calendar.fIsSet[0] = '\x01';
  (this->super_CECalendar).super_Calendar.fIsSet[1] = '\x01';
  (this->super_CECalendar).super_Calendar.fFields[1] = iVar1;
  (this->super_CECalendar).super_Calendar.fFields[2] = month;
  (this->super_CECalendar).super_Calendar.fStamp[2] = 1;
  (this->super_CECalendar).super_Calendar.fIsSet[2] = '\x01';
  (this->super_CECalendar).super_Calendar.fFields[5] = day;
  (this->super_CECalendar).super_Calendar.fStamp[5] = 1;
  (this->super_CECalendar).super_Calendar.fStamp[6] = 1;
  (this->super_CECalendar).super_Calendar.fIsSet[5] = '\x01';
  (this->super_CECalendar).super_Calendar.fIsSet[6] = '\x01';
  (this->super_CECalendar).super_Calendar.fFields[6] = month * 0x1e + day;
  return;
}

Assistant:

void
CopticCalendar::handleComputeFields(int32_t julianDay, UErrorCode &/*status*/)
{
    int32_t eyear, month, day, era, year;
    jdToCE(julianDay, getJDEpochOffset(), eyear, month, day);

    if (eyear <= 0) {
        era = BCE;
        year = 1 - eyear;
    } else {
        era = CE;
        year = eyear;
    }

    internalSet(UCAL_EXTENDED_YEAR, eyear);
    internalSet(UCAL_ERA, era);
    internalSet(UCAL_YEAR, year);
    internalSet(UCAL_MONTH, month);
    internalSet(UCAL_DATE, day);
    internalSet(UCAL_DAY_OF_YEAR, (30 * month) + day);
}